

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O2

UnicodeType
duckdb::Utf8Proc::Analyze
          (char *s,size_t len,UnicodeInvalidReason *invalid_reason,size_t *invalid_pos)

{
  byte bVar1;
  UnicodeType UVar2;
  uint uVar3;
  uint uVar4;
  int first_pos_seq;
  ulong uVar5;
  ulong local_38;
  
  UVar2 = ASCII;
  local_38 = 0;
  do {
    uVar5 = local_38;
    if (len <= local_38) {
      return UVar2;
    }
    do {
      local_38 = uVar5;
      if (len < local_38 + 8) break;
      uVar5 = local_38 + 8;
    } while ((*(ulong *)(s + local_38) & 0x8080808080808080) == 0);
    uVar5 = local_38 + 8;
    if (len <= local_38 + 8) {
      uVar5 = len;
    }
    for (; local_38 < uVar5; local_38 = local_38 + 1) {
      bVar1 = s[local_38];
      uVar3 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar4 = (uint)bVar1;
        first_pos_seq = (int)local_38;
        if ((uVar3 & 0xffffffe0) == 0xc0) {
          UVar2 = UTF8ExtraByteLoop<1,1920>
                            (first_pos_seq,uVar3 & 0x1f,&local_38,s,len,invalid_reason,invalid_pos);
        }
        else if ((uVar4 & 0xfffffff0) == 0xe0) {
          UVar2 = UTF8ExtraByteLoop<2,63488>
                            (first_pos_seq,uVar3 & 0xf,&local_38,s,len,invalid_reason,invalid_pos);
        }
        else {
          if ((uVar4 & 0xfffffff8) != 0xf0) {
            if (invalid_reason != (UnicodeInvalidReason *)0x0) {
              *invalid_reason = BYTE_MISMATCH;
            }
            if (invalid_pos == (size_t *)0x0) {
              return INVALID;
            }
            *invalid_pos = local_38;
            return INVALID;
          }
          UVar2 = UTF8ExtraByteLoop<3,2031616>
                            (first_pos_seq,uVar4 & 7,&local_38,s,len,invalid_reason,invalid_pos);
        }
        if (UVar2 == INVALID) {
          return INVALID;
        }
      }
    }
  } while( true );
}

Assistant:

UnicodeType Utf8Proc::Analyze(const char *s, size_t len, UnicodeInvalidReason *invalid_reason, size_t *invalid_pos) {
	UnicodeType type = UnicodeType::ASCII;

	static constexpr uint64_t MASK = 0x8080808080808080U;
	for (size_t i = 0; i < len;) {
		// Check 8 bytes at a time until we hit non-ASCII
		for (; i + sizeof(uint64_t) <= len; i += sizeof(uint64_t)) {
			if (Load<uint64_t>(const_data_ptr_cast(s + i)) & MASK) {
				break; // Non-ASCII in the next 8 bytes
			}
		}
		// Check 1 byte at a time for the next 8 bytes
		const auto end = MinValue(i + sizeof(uint64_t), len);
		for (; i < end; i++) {
			int c = (int)s[i];
			if ((c & 0x80) == 0) {
				continue;
			}
			int first_pos_seq = i;

			if ((c & 0xE0) == 0xC0) {
				/* 2 byte sequence */
				int utf8char = c & 0x1F;
				type = UTF8ExtraByteLoop<1, 0x000780>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else if ((c & 0xF0) == 0xE0) {
				/* 3 byte sequence */
				int utf8char = c & 0x0F;
				type = UTF8ExtraByteLoop<2, 0x00F800>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else if ((c & 0xF8) == 0xF0) {
				/* 4 byte sequence */
				int utf8char = c & 0x07;
				type = UTF8ExtraByteLoop<3, 0x1F0000>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else {
				/* invalid UTF-8 start byte */
				AssignInvalidUTF8Reason(invalid_reason, invalid_pos, i, UnicodeInvalidReason::BYTE_MISMATCH);
				return UnicodeType::INVALID;
			}
			if (type == UnicodeType::INVALID) {
				return type;
			}
		}
	}
	return type;
}